

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  bool bVar12;
  long lVar13;
  GLuint textures_legacy [2];
  GLuint textures_dsa [11] [2];
  int local_230 [2];
  ulong local_228;
  CreationTest *local_220;
  Enum<int,_2UL> local_218;
  int local_208 [22];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_220 = this;
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    local_230[0] = 0;
    local_230[1] = 0;
    local_208[0x14] = 0;
    local_208[0x15] = 0;
    local_208[0x10] = 0;
    local_208[0x11] = 0;
    local_208[0x12] = 0;
    local_208[0x13] = 0;
    local_208[0xc] = 0;
    local_208[0xd] = 0;
    local_208[0xe] = 0;
    local_208[0xf] = 0;
    local_208[8] = 0;
    local_208[9] = 0;
    local_208[10] = 0;
    local_208[0xb] = 0;
    local_208[4] = 0;
    local_208[5] = 0;
    local_208[6] = 0;
    local_208[7] = 0;
    local_208[0] = 0;
    local_208[1] = 0;
    local_208[2] = 0;
    local_208[3] = 0;
    (**(code **)(lVar8 + 0x6f8))(2,local_230);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x7b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    piVar11 = local_230;
    bVar4 = true;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      cVar5 = (**(code **)(lVar8 + 0xcc8))(*piVar11);
      if (cVar5 != '\0') {
        local_1b0._0_8_ = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GenTextures has created default objects, but it should create only a names.",
                   0x4b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar4 = false;
      }
      piVar11 = local_230 + 1;
      bVar3 = false;
    } while (bVar12);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar10 = 0;
    do {
      GVar2 = iterate::texture_targets[uVar10];
      local_228 = uVar10;
      (**(code **)(lVar8 + 0x400))(GVar2,2,local_208 + uVar10 * 2);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x8f);
      lVar9 = 0;
      bVar3 = true;
      do {
        bVar12 = bVar3;
        cVar5 = (**(code **)(lVar8 + 0xcc8))((local_208 + uVar10 * 2)[lVar9]);
        if (cVar5 == '\0') {
          local_1b0._0_8_ = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"CreateTextures has not created default objects for target ",
                     0x3a);
          local_218.m_getName = glu::getTextureTargetName;
          local_218.m_value = GVar2;
          tcu::Format::Enum<int,_2UL>::toStream(&local_218,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar4 = false;
        }
        lVar9 = 1;
        bVar3 = false;
      } while (bVar12);
      uVar10 = local_228 + 1;
    } while (uVar10 != 0xb);
    local_228 = local_228 & 0xffffffff00000000;
    lVar9 = 0;
    piVar11 = local_230;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      if (*piVar11 != 0) {
        (**(code **)(lVar8 + 0x480))(1);
        *piVar11 = 0;
      }
      lVar13 = 0;
      do {
        if (*(int *)((long)local_208 + lVar13 + lVar9 * 4) != 0) {
          (**(code **)(lVar8 + 0x480))(1);
          *(undefined4 *)((long)local_208 + lVar13 + lVar9 * 4) = 0;
        }
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x58);
      lVar9 = 1;
      piVar11 = local_230 + 1;
      bVar3 = false;
    } while (bVar12);
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (local_220->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar4) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else if ((char)local_228 == '\0') {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Error";
      testResult = QP_TEST_RESULT_INTERNAL_ERROR;
    }
  }
  else {
    this_00 = (local_220->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
	static const glw::GLuint texture_targets_count = sizeof(texture_targets) / sizeof(texture_targets[0]);
	static const glw::GLuint textures_count		   = 2;

	glw::GLuint textures_legacy[textures_count]						= {};
	glw::GLuint textures_dsa[texture_targets_count][textures_count] = {};

	try
	{
		/* Check legacy state creation. */
		gl.genTextures(textures_count, textures_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		for (glw::GLuint i = 0; i < textures_count; ++i)
		{
			if (gl.isTexture(textures_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenTextures has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			gl.createTextures(texture_targets[j], textures_count, textures_dsa[j]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

			for (glw::GLuint i = 0; i < textures_count; ++i)
			{
				if (!gl.isTexture(textures_dsa[j][i]))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "CreateTextures has not created default objects for target "
						<< glu::getTextureTargetStr(texture_targets[j]) << "." << tcu::TestLog::EndMessage;
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < textures_count; ++i)
	{
		if (textures_legacy[i])
		{
			gl.deleteTextures(1, &textures_legacy[i]);

			textures_legacy[i] = 0;
		}

		for (glw::GLuint j = 0; j < texture_targets_count; ++j)
		{
			if (textures_dsa[j][i])
			{
				gl.deleteTextures(1, &textures_dsa[j][i]);

				textures_dsa[j][i] = 0;
			}
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}